

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicAlloc
          (LLVMPointerGraphBuilder *this,CallInst *CInst,AllocationFunction type)

{
  long lVar1;
  PSNode *pPVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  raw_ostream *prVar5;
  PSNode *pPVar6;
  
  pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  pPVar6 = (PSNode *)0x0;
  if (pPVar2->type == ALLOC) {
    pPVar6 = pPVar2;
  }
  *(undefined1 *)((long)&pPVar6[1]._vptr_PSNode + 1) = 1;
  if (type != ALLOCA) {
    if (type == CALLOC) {
      *(undefined1 *)&pPVar6[1]._vptr_PSNode = 1;
      lVar1 = 0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5);
      goto LAB_001307df;
    }
    if (type != MALLOC) {
      prVar5 = (raw_ostream *)llvm::errs();
      prVar5 = llvm::operator<<(prVar5,(Value *)CInst);
      llvm::raw_ostream::operator<<(prVar5,"\n");
      abort();
    }
  }
  lVar1 = -(ulong)(uint)(*(int *)(CInst + 0x14) << 5);
LAB_001307df:
  uVar3 = llvmutils::getConstantSizeValue(*(Value **)(CInst + lVar1));
  if ((type == CALLOC) && (uVar3 != 0)) {
    uVar4 = llvmutils::getConstantSizeValue
                      (*(Value **)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
    uVar3 = uVar3 * uVar4;
  }
  (pPVar6->super_SubgraphNode<dg::pta::PSNode>).size = uVar3;
  return pPVar6;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createDynamicAlloc(const llvm::CallInst *CInst,
                                                    AllocationFunction type) {
    using namespace llvm;

    const Value *op;
    uint64_t size = 0, size2 = 0;
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    node->setIsHeap();

    switch (type) {
    case AllocationFunction::MALLOC:
        node->setIsHeap();
        /* fallthrough */
    case AllocationFunction::ALLOCA:
        op = CInst->getOperand(0);
        break;
    case AllocationFunction::CALLOC:
        node->setIsHeap();
        node->setZeroInitialized();
        op = CInst->getOperand(1);
        break;
    default:
        errs() << *CInst << "\n";
        assert(0 && "unknown memory allocation type");
        // for NDEBUG
        abort();
    };

    // infer allocated size
    size = llvmutils::getConstantSizeValue(op);
    if (size != 0 && type == AllocationFunction::CALLOC) {
        // if this is call to calloc, the size is given
        // in the first argument too
        size2 = llvmutils::getConstantSizeValue(CInst->getOperand(0));
        // if both ops are constants, multiply them to get
        // the correct size, otherwise return 0 (unknown)
        size = size2 != 0 ? size * size2 : 0;
    }

    node->setSize(size);
    return node;
}